

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

bool __thiscall cmFileLockPool::ScopePool::IsAlreadyLocked(ScopePool *this,string *filename)

{
  cmFileLock *pcVar1;
  bool bVar2;
  cmFileLock *this_00;
  long lVar3;
  cmFileLock *pcVar4;
  
  this_00 = (this->Locks).super__Vector_base<cmFileLock,_std::allocator<cmFileLock>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar1 = (this->Locks).super__Vector_base<cmFileLock,_std::allocator<cmFileLock>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = ((long)pcVar1 - (long)this_00 >> 3) * -0x3333333333333333 >> 2;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = cmFileLock::IsLocked(this_00,filename);
      pcVar4 = this_00;
      if (bVar2) goto LAB_003d50c0;
      bVar2 = cmFileLock::IsLocked(this_00 + 1,filename);
      pcVar4 = this_00 + 1;
      if (bVar2) goto LAB_003d50c0;
      bVar2 = cmFileLock::IsLocked(this_00 + 2,filename);
      pcVar4 = this_00 + 2;
      if (bVar2) goto LAB_003d50c0;
      bVar2 = cmFileLock::IsLocked(this_00 + 3,filename);
      pcVar4 = this_00 + 3;
      if (bVar2) goto LAB_003d50c0;
      this_00 = this_00 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = ((long)pcVar1 - (long)this_00 >> 3) * -0x3333333333333333;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pcVar4 = pcVar1;
      if ((lVar3 != 3) || (bVar2 = cmFileLock::IsLocked(this_00,filename), pcVar4 = this_00, bVar2))
      goto LAB_003d50c0;
      this_00 = this_00 + 1;
    }
    bVar2 = cmFileLock::IsLocked(this_00,filename);
    pcVar4 = this_00;
    if (bVar2) goto LAB_003d50c0;
    this_00 = this_00 + 1;
  }
  bVar2 = cmFileLock::IsLocked(this_00,filename);
  pcVar4 = this_00;
  if (!bVar2) {
    pcVar4 = pcVar1;
  }
LAB_003d50c0:
  return pcVar4 != pcVar1;
}

Assistant:

bool cmFileLockPool::ScopePool::IsAlreadyLocked(
  const std::string& filename) const
{
  return std::any_of(this->Locks.begin(), this->Locks.end(),
                     [&filename](cmFileLock const& lock) -> bool {
                       return lock.IsLocked(filename);
                     });
}